

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

_Bool background_thread_create_locked(tsd_t *tsd,uint arena_ind)

{
  tsd_t *tsd_00;
  background_thread_info_t *pbVar1;
  uint uVar2;
  void *arg;
  pthread_attr_t *attr;
  _func_void_ptr_void_ptr *start_routine;
  _Bool _Var3;
  arena_t *arena;
  malloc_mutex_t *mutex;
  pthread_mutex_t *__mutex;
  
  attr = (pthread_attr_t *)((ulong)arena_ind % duckdb_je_max_background_threads);
  arg = (void *)((long)attr * 0xd0);
  tsd_00 = (tsd_t *)(duckdb_je_background_thread_info + (long)attr);
  mutex = &duckdb_je_background_thread_info[(long)attr].mtx;
  arena = (arena_t *)mutex;
  malloc_mutex_lock((tsdn_t *)tsd,mutex);
  if (((duckdb_je_background_thread_enabled_state.repr & 1U) == 0) ||
     (*(int *)((tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard +
              7) != 0)) {
    *(undefined1 *)
     &tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small =
         0;
    __mutex = (pthread_mutex_t *)
              &tsd_00->
               cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_large;
    _Var3 = false;
  }
  else {
    background_thread_init(tsd_00,(background_thread_info_t *)arena);
    *(undefined1 *)
     &tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small =
         0;
    __mutex = (pthread_mutex_t *)
              &tsd_00->
               cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_large;
    pthread_mutex_unlock(__mutex);
    pbVar1 = duckdb_je_background_thread_info;
    if (arena_ind == 0) {
      pre_reentrancy(tsd,arena);
      uVar2 = background_thread_create_signals_masked((pthread_t *)tsd_00,attr,start_routine,arg);
      post_reentrancy(tsd);
      if (uVar2 == 0) {
        return false;
      }
      duckdb_je_malloc_printf
                ("<jemalloc>: arena 0 background thread creation failed (%d)\n",(ulong)uVar2);
      malloc_mutex_lock((tsdn_t *)tsd,mutex);
      (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[7] = '\0';
      (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[8] = '\0';
      (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[9] = '\0';
      (tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard[10] = '\0';
      duckdb_je_n_background_threads = duckdb_je_n_background_threads - 1;
      *(undefined1 *)
       &tsd_00->cant_access_tsd_items_directly_use_a_getter_or_setter_san_extents_until_guard_small
           = 0;
      _Var3 = true;
    }
    else {
      malloc_mutex_lock((tsdn_t *)tsd,&duckdb_je_background_thread_info->mtx);
      pthread_cond_signal((pthread_cond_t *)&pbVar1->cond);
      (pbVar1->mtx).field_0.field_0.locked.repr = false;
      __mutex = (pthread_mutex_t *)((long)&(pbVar1->mtx).field_0 + 0x48);
      _Var3 = false;
    }
  }
  pthread_mutex_unlock(__mutex);
  return _Var3;
}

Assistant:

static bool
background_thread_create_locked(tsd_t *tsd, unsigned arena_ind) {
	assert(have_background_thread);
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);

	/* We create at most NCPUs threads. */
	size_t thread_ind = arena_ind % max_background_threads;
	background_thread_info_t *info = &background_thread_info[thread_ind];

	bool need_new_thread;
	malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
	need_new_thread = background_thread_enabled() &&
	    (info->state == background_thread_stopped);
	if (need_new_thread) {
		background_thread_init(tsd, info);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
	if (!need_new_thread) {
		return false;
	}
	if (arena_ind != 0) {
		/* Threads are created asynchronously by Thread 0. */
		background_thread_info_t *t0 = &background_thread_info[0];
		malloc_mutex_lock(tsd_tsdn(tsd), &t0->mtx);
		assert(t0->state == background_thread_started);
		pthread_cond_signal(&t0->cond);
		malloc_mutex_unlock(tsd_tsdn(tsd), &t0->mtx);

		return false;
	}

	pre_reentrancy(tsd, NULL);
	/*
	 * To avoid complications (besides reentrancy), create internal
	 * background threads with the underlying pthread_create.
	 */
	int err = background_thread_create_signals_masked(&info->thread, NULL,
		/* NOLINTNEXTLINE(performance-no-int-to-ptr) */
	    background_thread_entry, (void *)thread_ind);
	post_reentrancy(tsd);

	if (err != 0) {
		malloc_printf("<jemalloc>: arena 0 background thread creation "
		    "failed (%d)\n", err);
		malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
		info->state = background_thread_stopped;
		n_background_threads--;
		malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);

		return true;
	}

	return false;
}